

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.h
# Opt level: O1

uint32 __thiscall
google::protobuf::internal::ReflectionSchema::GetFieldOffset
          (ReflectionSchema *this,FieldDescriptor *field)

{
  long lVar1;
  uint32 uVar2;
  uint uVar3;
  FieldDescriptor *local_20;
  _func_void_FieldDescriptor_ptr *local_18;
  
  lVar1 = *(long *)(field + 0x58);
  if (lVar1 != 0) {
    uVar3 = this->offsets_
            [(long)((int)((ulong)(lVar1 - *(long *)(*(long *)(lVar1 + 0x10) + 0x30)) >> 4) *
                   -0x55555555) + (long)*(int *)(*(long *)(field + 0x50) + 0x68)];
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_18 = FieldDescriptor::TypeOnceInit;
      local_20 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),&local_18,&local_20);
    }
    if ((*(int *)(field + 0x38) == 0xc) || (*(int *)(field + 0x38) == 9)) {
      uVar3 = uVar3 & 0xfffffffe;
    }
    return uVar3;
  }
  uVar2 = GetFieldOffsetNonOneof(this,field);
  return uVar2;
}

Assistant:

uint32 GetFieldOffset(const FieldDescriptor* field) const {
    if (field->containing_oneof()) {
      size_t offset =
          static_cast<size_t>(field->containing_type()->field_count() +
                              field->containing_oneof()->index());
      return OffsetValue(offsets_[offset], field->type());
    } else {
      return GetFieldOffsetNonOneof(field);
    }
  }